

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O2

uint8 * google::protobuf::io::CodedOutputStream::WriteVarint64ToArray(uint64 value,uint8 *target)

{
  bool bVar1;
  uint8 *puVar2;
  uint8 *puVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (value < 0x80) {
    *target = (byte)value;
    return target + 1;
  }
  *target = (byte)value | 0x80;
  if (value < 0x4000) {
    target[1] = (uint8)(value >> 7);
    return target + 2;
  }
  puVar2 = target + 2;
  uVar4 = value >> 7;
  do {
    puVar3 = puVar2;
    puVar3[-1] = (byte)uVar4 | 0x80;
    uVar5 = uVar4 >> 7;
    bVar1 = 0x3fff < uVar4;
    puVar2 = puVar3 + 1;
    uVar4 = uVar5;
  } while (bVar1);
  *puVar3 = (uint8)uVar5;
  return puVar3 + 1;
}

Assistant:

inline uint8* CodedOutputStream::WriteVarint64ToArray(uint64 value,
                                                      uint8* target) {
  return EpsCopyOutputStream::UnsafeVarint(value, target);
}